

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O0

void __thiscall Jinx::Variant::SetBuffer(Variant *this,BufferPtr *value)

{
  bool bVar1;
  BufferPtr *value_local;
  Variant *this_local;
  
  Destroy(this);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)value);
  if (!bVar1) {
    this->m_type = Null;
    (this->field_1).m_number = 0.0;
  }
  this->m_type = Buffer;
  std::shared_ptr<Jinx::Buffer>::shared_ptr((shared_ptr<Jinx::Buffer> *)&(this->field_1).m_string);
  std::shared_ptr<Jinx::Buffer>::operator=
            ((shared_ptr<Jinx::Buffer> *)&(this->field_1).m_string,value);
  return;
}

Assistant:

inline_t void Variant::SetBuffer(const BufferPtr & value)
	{
		Destroy();
		if (!value)
		{
			m_type = ValueType::Null;
			m_integer = 0;
		}
		m_type = ValueType::Buffer;
		new(&m_buffer) BufferPtr();
		m_buffer = value;
	}